

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  short sVar5;
  float fVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiWindow *pIVar11;
  ImGuiWindow *pIVar12;
  ImGuiContext *g;
  byte bVar13;
  char cVar14;
  float fVar15;
  long lVar16;
  int iVar17;
  bool bVar18;
  ImGuiWindow *pIVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar10 = GImGui;
  fVar21 = (GImGui->Style).TouchExtraPadding.x;
  fVar22 = (GImGui->Style).TouchExtraPadding.y;
  if (fVar21 <= 4.0) {
    fVar21 = 4.0;
  }
  if (fVar22 <= 4.0) {
    fVar22 = 4.0;
  }
  IVar9.y = fVar22;
  IVar9.x = fVar21;
  GImGui->WindowsHoverPadding = IVar9;
  pIVar11 = pIVar10->MovingWindow;
  pIVar19 = (ImGuiWindow *)0x0;
  if ((pIVar11 != (ImGuiWindow *)0x0) && ((pIVar11->Flags & 0x200) == 0)) {
    pIVar19 = pIVar11;
  }
  fVar21 = (pIVar10->Style).TouchExtraPadding.x;
  bVar20 = (pIVar10->IO).ConfigWindowsResizeFromEdges;
  fVar22 = fVar21;
  if (bVar20 == true) {
    fVar22 = (pIVar10->WindowsHoverPadding).x;
  }
  fVar6 = (pIVar10->Style).TouchExtraPadding.y;
  fVar15 = fVar6;
  if (bVar20 != false) {
    fVar15 = (pIVar10->WindowsHoverPadding).y;
  }
  lVar16 = (long)(pIVar10->Windows).Size;
  if (lVar16 < 1) {
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    lVar16 = lVar16 + 1;
    pIVar12 = (ImGuiWindow *)0x0;
    do {
      pIVar8 = (pIVar10->Windows).Data[lVar16 + -2];
      bVar20 = false;
      if (((pIVar8->Active == true) && (pIVar8->Hidden == false)) &&
         (uVar7 = pIVar8->Flags, (uVar7 >> 9 & 1) == 0)) {
        fVar23 = fVar21;
        if ((uVar7 & 0x1000042) == 0) {
          fVar23 = fVar22;
        }
        fVar2 = (pIVar10->IO).MousePos.x;
        if ((pIVar8->OuterRectClipped).Min.x - fVar23 <= fVar2) {
          fVar24 = fVar6;
          if ((uVar7 & 0x1000042) == 0) {
            fVar24 = fVar15;
          }
          fVar3 = (pIVar10->IO).MousePos.y;
          if ((((pIVar8->OuterRectClipped).Min.y - fVar24 <= fVar3) &&
              (fVar2 < fVar23 + (pIVar8->OuterRectClipped).Max.x)) &&
             (fVar3 < fVar24 + (pIVar8->OuterRectClipped).Max.y)) {
            sVar5 = (pIVar8->HitTestHoleSize).x;
            if (sVar5 != 0) {
              fVar23 = (float)(int)(pIVar8->HitTestHoleOffset).x + (pIVar8->Pos).x;
              if (fVar23 <= fVar2) {
                fVar24 = (float)(int)(pIVar8->HitTestHoleOffset).y + (pIVar8->Pos).y;
                bVar20 = (fVar3 < (float)(int)(pIVar8->HitTestHoleSize).y + fVar24 &&
                         fVar2 < fVar23 + (float)(int)sVar5) && fVar24 <= fVar3;
              }
              else {
                bVar20 = false;
              }
              if (bVar20) {
                bVar20 = false;
                goto LAB_00142ac9;
              }
            }
            if (pIVar19 == (ImGuiWindow *)0x0) {
              pIVar19 = pIVar8;
            }
            if (((pIVar12 == (ImGuiWindow *)0x0) &&
                (pIVar12 = pIVar8, pIVar11 != (ImGuiWindow *)0x0)) &&
               (pIVar8->RootWindow == pIVar11->RootWindow)) {
              pIVar12 = (ImGuiWindow *)0x0;
            }
            bVar20 = pIVar12 != (ImGuiWindow *)0x0 && pIVar19 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_00142ac9:
    } while ((!bVar20) && (lVar16 = lVar16 + -1, 1 < lVar16));
  }
  pIVar10->HoveredWindow = pIVar19;
  pIVar10->HoveredWindowUnderMovingWindow = pIVar12;
  pIVar11 = GetTopMostPopupModal();
  bVar20 = false;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar20 = false, pIVar19 != (ImGuiWindow *)0x0)) {
    pIVar12 = pIVar19->RootWindow;
    if (pIVar12->RootWindow == pIVar11) {
      bVar20 = false;
    }
    else if (pIVar12 == (ImGuiWindow *)0x0) {
      bVar20 = true;
    }
    else {
      do {
        bVar20 = pIVar12 == pIVar11;
        if (bVar20) goto LAB_00142b2c;
        pIVar12 = pIVar12->ParentWindow;
      } while (pIVar12 != (ImGuiWindow *)0x0);
      bVar20 = false;
LAB_00142b2c:
      bVar20 = (bool)(bVar20 ^ 1);
    }
  }
  uVar7 = (pIVar10->IO).ConfigFlags;
  iVar17 = -1;
  lVar16 = 0;
  bVar13 = 0;
  do {
    if ((pIVar10->IO).MouseClicked[lVar16] == true) {
      bVar18 = true;
      if (pIVar19 == (ImGuiWindow *)0x0) {
        bVar18 = 0 < (pIVar10->OpenPopupStack).Size;
      }
      (pIVar10->IO).MouseDownOwned[lVar16] = bVar18;
    }
    bVar18 = (pIVar10->IO).MouseDown[lVar16];
    if ((bVar18 == true) &&
       ((iVar17 == -1 ||
        (dVar4 = (pIVar10->IO).MouseClickedTime[iVar17],
        pdVar1 = (pIVar10->IO).MouseClickedTime + lVar16, *pdVar1 <= dVar4 && dVar4 != *pdVar1)))) {
      iVar17 = (int)lVar16;
    }
    bVar13 = bVar13 & 1 | bVar18;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 5);
  bVar18 = true;
  if ((uVar7 & 0x10) == 0) {
    bVar18 = bVar20;
  }
  cVar14 = '\x01';
  if (iVar17 != -1) {
    cVar14 = (pIVar10->IO).MouseDownOwned[iVar17];
  }
  bVar20 = true;
  if ((pIVar10->DragDropActive == true) &&
     (bVar20 = true, (pIVar10->DragDropSourceFlags & 0x10) != 0)) {
    bVar20 = bVar18;
  }
  if (cVar14 != '\0') {
    bVar20 = bVar18;
  }
  if (bVar20) {
    pIVar10->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar10->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar10->WantCaptureMouseNextFrame == -1) {
    if ((cVar14 == '\0') ||
       ((bVar20 = true, pIVar10->HoveredWindow == (ImGuiWindow *)0x0 && (bVar13 == 0)))) {
      bVar20 = 0 < (pIVar10->OpenPopupStack).Size;
    }
    (pIVar10->IO).WantCaptureMouse = bVar20;
  }
  else {
    (pIVar10->IO).WantCaptureMouse = pIVar10->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar10->WantCaptureKeyboardNextFrame == -1) {
    bVar20 = pIVar10->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
  }
  else {
    bVar20 = pIVar10->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar10->IO).WantCaptureKeyboard = bVar20;
  if (((uVar7 & 9) == 1 & (pIVar10->IO).NavActive) == 1) {
    (pIVar10->IO).WantCaptureKeyboard = true;
  }
  (pIVar10->IO).WantTextInput = pIVar10->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}